

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int run_ipc_test(char *helper,uv_read_cb read_cb)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 *extraout_RDX;
  long lVar4;
  uv_process_t process;
  uv_process_t uStack_98;
  
  spawn_helper(&channel,&uStack_98,helper);
  uv_read_start((uv_stream_t *)&channel,on_alloc,read_cb);
  puVar2 = uv_default_loop();
  lVar4 = 0;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    lVar4 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_ipc_test_cold_1();
  }
  run_ipc_test_cold_2();
  if (lVar4 != 0) {
    if (lVar4 < 0) {
      if (lVar4 != -0xfff) {
        pcVar3 = uv_strerror((int)lVar4);
        printf("error recving on channel: %s\n",pcVar3);
        abort();
      }
    }
    else {
      on_read_cold_1();
    }
  }
  free((void *)*extraout_RDX);
  return extraout_EAX;
}

Assistant:

static int run_ipc_test(const char* helper, uv_read_cb read_cb) {
  uv_process_t process;
  int r;

  spawn_helper(&channel, &process, helper);
  uv_read_start((uv_stream_t*)&channel, on_alloc, read_cb);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}